

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O1

void replmon(monst *mtmp,monst *mtmp2)

{
  xchar x;
  xchar y;
  permonst *ppVar1;
  level *lev;
  int iVar2;
  obj *poVar3;
  char *pcVar4;
  uint range;
  
  for (poVar3 = mtmp2->minvent; poVar3 != (obj *)0x0; poVar3 = poVar3->nobj) {
    (poVar3->v).v_ocarry = mtmp2;
  }
  mtmp->minvent = (obj *)0x0;
  relmon(mtmp);
  if (u.usteed != mtmp) {
    place_monster(mtmp2,(int)mtmp2->mx,(int)mtmp2->my);
  }
  if (mtmp2->wormno != '\0') {
    place_wsegs(mtmp2);
  }
  ppVar1 = mtmp2->data;
  if ((ppVar1 != mons + 0x101 && (ppVar1 != mons + 0x21 && ppVar1 != mons + 0x20)) &&
      ppVar1->mlet != '\x19') {
    pcVar4 = mons_mname(ppVar1);
    iVar2 = strcmp(pcVar4,"gold dragon");
    if (iVar2 != 0) {
      pcVar4 = mons_mname(mtmp2->data);
      iVar2 = strcmp(pcVar4,"baby gold dragon");
      if ((iVar2 != 0) && (mtmp2->data != mons + 0xa0 && mtmp2->data != mons + 0x73))
      goto LAB_001e8002;
    }
  }
  ppVar1 = mtmp2->data;
  lev = mtmp2->dlevel;
  x = mtmp2->mx;
  y = mtmp2->my;
  range = 1;
  if ((ppVar1 != mons + 0x101 && (ppVar1 != mons + 0x21 && ppVar1 != mons + 0x20)) &&
      ppVar1->mlet != '\x19') {
    pcVar4 = mons_mname(ppVar1);
    iVar2 = strcmp(pcVar4,"gold dragon");
    if (iVar2 != 0) {
      pcVar4 = mons_mname(mtmp2->data);
      iVar2 = strcmp(pcVar4,"baby gold dragon");
      if ((iVar2 != 0) && (mtmp2->data != mons + 0x73)) {
        range = (uint)(mtmp2->data == mons + 0xa0);
      }
    }
  }
  new_light_source(lev,x,y,range,1,mtmp2);
  del_light_source(mtmp->dlevel,1,mtmp);
LAB_001e8002:
  mtmp2->nmon = mtmp2->dlevel->monlist;
  mtmp2->dlevel->monlist = mtmp2;
  if (u.ustuck == mtmp) {
    u.ustuck = mtmp2;
  }
  if (u.usteed == mtmp) {
    u.usteed = mtmp2;
  }
  if ((mtmp2->field_0x63 & 2) != 0) {
    replshk(mtmp,mtmp2);
  }
  free(mtmp);
  return;
}

Assistant:

void replmon(struct monst *mtmp, struct monst *mtmp2)
{
    struct obj *otmp;

    /* transfer the monster's inventory */
    for (otmp = mtmp2->minvent; otmp; otmp = otmp->nobj)
	otmp->ocarry = mtmp2;

    mtmp->minvent = 0;

    /* remove the old monster from the map and from `level->monlist' list */
    relmon(mtmp);

    /* finish adding its replacement */
    if (mtmp != u.usteed)	/* don't place steed onto the map */
	place_monster(mtmp2, mtmp2->mx, mtmp2->my);
    if (mtmp2->wormno)	    /* update level->monsters[wseg->wx][wseg->wy] */
	place_wsegs(mtmp2); /* locations to mtmp2 not mtmp. */
    if (emits_light(mtmp2->data)) {
	/* since this is so rare, we don't have any `mon_move_light_source' */
	new_light_source(mtmp2->dlevel, mtmp2->mx, mtmp2->my,
			 emits_light(mtmp2->data),
			 LS_MONSTER, mtmp2);
	/* here we rely on the fact that `mtmp' hasn't actually been deleted */
	del_light_source(mtmp->dlevel, LS_MONSTER, mtmp);
    }
    mtmp2->nmon = mtmp2->dlevel->monlist;
    mtmp2->dlevel->monlist = mtmp2;
    if (u.ustuck == mtmp) u.ustuck = mtmp2;
    if (u.usteed == mtmp) u.usteed = mtmp2;
    if (mtmp2->isshk) replshk(mtmp,mtmp2);

    /* discard the old monster */
    dealloc_monst(mtmp);
}